

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItemPrivate::prependGraphicsTransform(QGraphicsItemPrivate *this,QGraphicsTransform *t)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  TransformData *pTVar4;
  long in_RCX;
  long lVar5;
  qreal *pqVar6;
  TransformData *pTVar7;
  long lVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QGraphicsTransform *local_20;
  long local_18;
  
  bVar9 = 0;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->transformData == (TransformData *)0x0) {
    pTVar4 = (TransformData *)operator_new(0x90);
    pqVar6 = (qreal *)&DAT_00700e28;
    pTVar7 = pTVar4;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pTVar7->transform).m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar9 * -2 + 1;
      pTVar7 = (TransformData *)((long)pTVar7 + (ulong)bVar9 * -0x10 + 8);
    }
    puVar1 = &(pTVar4->transform).field_0x48;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
    in_RCX = 0x3ff0000000000000;
    pTVar4->scale = 1.0;
    pTVar4->rotation = 0.0;
    pTVar4->xOrigin = 0.0;
    pTVar4->yOrigin = 0.0;
    (pTVar4->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar4->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar4->graphicsTransforms).d.size = 0;
    pTVar4->onlyTransform = true;
    this->transformData = pTVar4;
  }
  pTVar7 = this->transformData;
  lVar5 = (pTVar7->graphicsTransforms).d.size;
  if (lVar5 != 0) {
    lVar8 = -8;
    do {
      lVar2 = lVar5 * -8 + lVar8;
      if (lVar2 == -8) goto LAB_005eaf2d;
      in_RCX = lVar8 + 8;
      lVar3 = lVar8 + 8;
      lVar8 = in_RCX;
    } while (*(QGraphicsTransform **)((long)(pTVar7->graphicsTransforms).d.ptr + lVar3) != t);
    in_RCX = in_RCX >> 3;
LAB_005eaf2d:
    if (lVar2 != -8) goto LAB_005eaf3a;
  }
  in_RCX = -1;
LAB_005eaf3a:
  if (in_RCX == -1) {
    local_20 = t;
    QtPrivate::QPodArrayOps<QGraphicsTransform*>::emplace<QGraphicsTransform*&>
              ((QPodArrayOps<QGraphicsTransform*> *)&pTVar7->graphicsTransforms,0,&local_20);
  }
  QGraphicsTransformPrivate::setItem(*(QGraphicsTransformPrivate **)&t->field_0x8,this->q_ptr);
  this->transformData->onlyTransform = false;
  this->field_0x166 = this->field_0x166 | 0x20;
  (*this->_vptr_QGraphicsItemPrivate[4])(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::prependGraphicsTransform(QGraphicsTransform *t)
{
    if (!transformData)
        transformData = new QGraphicsItemPrivate::TransformData;
    if (!transformData->graphicsTransforms.contains(t))
        transformData->graphicsTransforms.prepend(t);

    Q_Q(QGraphicsItem);
    t->d_func()->setItem(q);
    transformData->onlyTransform = false;
    dirtySceneTransform = 1;
    transformChanged();
}